

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acutest.h
# Opt level: O1

int main(int argc,char **argv)

{
  ACUTEST_CMDLINE_OPTION_ *pAVar1;
  acutest_test_ *test;
  bool bVar2;
  undefined1 auVar3 [16];
  acutest_test_data_ *paVar4;
  byte bVar5;
  FILE *__s;
  int n_7;
  int iVar6;
  int iVar7;
  acutest_state_ aVar8;
  __pid_t __pid;
  ACUTEST_CMDLINE_OPTION_ *pAVar9;
  long lVar10;
  ssize_t sVar11;
  char *pcVar12;
  uint *puVar13;
  char *pcVar14;
  char cVar15;
  int n;
  uint uVar16;
  int iVar17;
  size_t sVar18;
  ulong uVar19;
  char *pcVar20;
  timespec *ptVar21;
  int n_6;
  int n_8;
  ACUTEST_CMDLINE_OPTION_ *pAVar22;
  int iVar23;
  int n_5;
  uint uVar24;
  timespec *__dest;
  int n_4;
  bool bVar25;
  undefined1 auVar26 [16];
  int exit_code;
  acutest_timer_type_ start;
  acutest_timer_type_ end;
  int local_278;
  uint local_24c;
  timespec local_248;
  timespec local_238 [2];
  undefined1 local_218;
  undefined8 local_59;
  long lStack_51;
  long lVar27;
  
  acutest_argv0_ = *argv;
  acutest_colorize_ = isatty(1);
  acutest_list_size_ = 1;
  acutest_test_data_ = (acutest_test_data_ *)calloc(9,0x10);
  if (acutest_test_data_ == (acutest_test_data_ *)0x0) {
    main_cold_1();
  }
  local_218 = 0;
  if (1 < argc) {
    iVar23 = 1;
    bVar2 = false;
LAB_001030b0:
    if (bVar2) {
LAB_001030b7:
      ptVar21 = (timespec *)argv[iVar23];
      iVar7 = 0;
      goto LAB_001030c2;
    }
    ptVar21 = (timespec *)argv[iVar23];
    iVar7 = strcmp((char *)ptVar21,"-");
    if (iVar7 == 0) goto LAB_001030b7;
    iVar7 = strcmp((char *)ptVar21,"--");
    if (iVar7 != 0) {
      if ((char)ptVar21->tv_sec != '-') {
        bVar2 = false;
        iVar7 = 0;
        goto LAB_001030c2;
      }
      bVar25 = false;
      iVar7 = 0x58;
      pAVar22 = acutest_cmdline_options_;
      local_278 = 0;
      do {
        pcVar12 = pAVar22->longname;
        if (pcVar12 == (char *)0x0) {
LAB_00103164:
          if (((pAVar22->shortname != '\0') && (pcVar12 = argv[iVar23], *pcVar12 == '-')) &&
             (pcVar12[1] == pAVar22->shortname)) {
            if ((pAVar22->flags & 2) == 0) {
              iVar6 = acutest_cmdline_callback_(iVar7,(char *)0x0);
              if (iVar6 == 0) {
                pcVar12 = argv[iVar23];
                cVar15 = pcVar12[2];
                local_278 = 0;
                iVar6 = local_278;
                if (cVar15 != '\0') {
                  lVar10 = 0;
                  goto LAB_001032c7;
                }
              }
            }
            else if (pcVar12[2] == '\0') {
              iVar17 = iVar23 + 1;
              if (iVar17 < argc) {
                iVar6 = acutest_cmdline_callback_(iVar7,argv[iVar17]);
                iVar23 = iVar17;
              }
              else {
                iVar6 = acutest_cmdline_callback_(-0x7ffffffe,pcVar12);
              }
            }
            else {
              iVar6 = acutest_cmdline_callback_(iVar7,pcVar12 + 2);
            }
            break;
          }
        }
        else {
          pcVar20 = argv[iVar23];
          iVar6 = strncmp(pcVar20,"--",2);
          if (iVar6 != 0) goto LAB_00103164;
          sVar18 = strlen(pcVar12);
          iVar6 = strncmp(pcVar20 + 2,pcVar12,sVar18);
          if (iVar6 == 0) {
            if (pcVar20[sVar18 + 2] == '=') {
              if ((pAVar22->flags & 3) == 0) {
                ptVar21 = local_238;
                snprintf((char *)ptVar21,0x21,"--%s",pcVar12);
                iVar7 = -0x7ffffffd;
              }
              else {
                ptVar21 = (timespec *)(pcVar20 + 2 + sVar18 + 1);
              }
              local_278 = acutest_cmdline_callback_(iVar7,(char *)ptVar21);
              bVar2 = true;
            }
            else {
              if (pcVar20[sVar18 + 2] != '\0') goto LAB_001031a9;
              if ((pAVar22->flags & 2) == 0) {
                pcVar20 = (char *)0x0;
              }
              else {
                iVar7 = -0x7ffffffe;
              }
              local_278 = acutest_cmdline_callback_(iVar7,pcVar20);
              bVar2 = true;
            }
          }
          else {
LAB_001031a9:
            bVar2 = false;
          }
          iVar6 = local_278;
          if (bVar2) break;
        }
        iVar7 = pAVar22[1].id;
        pAVar22 = pAVar22 + 1;
        bVar25 = iVar7 == 0;
        iVar6 = local_278;
      } while (!bVar25);
      goto LAB_00103361;
    }
    bVar2 = true;
    local_278 = 0;
    goto LAB_001030c7;
  }
LAB_00103453:
  bVar5 = acutest_exclude_mode_;
  paVar4 = acutest_test_data_;
  auVar3 = _DAT_00106020;
  if (acutest_timer_ - 1U < 2) {
    acutest_timer_id_ = acutest_timer_;
  }
  lVar10 = 0;
  iVar23 = 0;
  do {
    iVar23 = iVar23 + (uint)(*(int *)((long)&acutest_test_data_->state + lVar10) == -3);
    lVar10 = lVar10 + 0x10;
  } while (lVar10 != 0x90);
  if (iVar23 == 0) {
    lVar10 = 0x10;
    auVar26 = _DAT_00106010;
    do {
      if (SUB164(auVar26 ^ auVar3,4) == -0x80000000 && SUB164(auVar26 ^ auVar3,0) < -0x7ffffff7) {
        *(undefined4 *)((long)&paVar4[-1].state + lVar10) = 0xfffffffe;
        *(undefined4 *)((long)&paVar4->state + lVar10) = 0xfffffffe;
      }
      lVar27 = auVar26._8_8_;
      auVar26._0_8_ = auVar26._0_8_ + 2;
      auVar26._8_8_ = lVar27 + 2;
      lVar10 = lVar10 + 0x20;
    } while (lVar10 != 0xb0);
  }
  else {
    lVar10 = 0;
    do {
      *(uint *)((long)&paVar4->state + lVar10) =
           ~(uint)(*(int *)((long)&paVar4->state + lVar10) == -3 ^ bVar5) | 0xfffffffe;
      lVar10 = lVar10 + 0x10;
    } while (lVar10 != 0x90);
  }
  iVar23 = acutest_no_exec_;
  if (acutest_no_exec_ < 0) {
    lVar10 = 0;
    uVar16 = 0;
    do {
      uVar16 = uVar16 + (*(int *)((long)&acutest_test_data_->state + lVar10) == -2);
      lVar10 = lVar10 + 0x10;
    } while (lVar10 != 0x90);
    iVar23 = 1;
    if (1 < uVar16) {
      local_238[0].tv_sec = CONCAT71(local_238[0].tv_sec._1_7_,10);
      iVar7 = 0;
      iVar23 = open("/proc/self/status",0);
      if (iVar23 != -1) {
        uVar19 = 1;
LAB_001035c0:
        do {
          if (uVar19 < 0x1ff) {
            sVar11 = read(iVar23,(void *)((long)&local_238[0].tv_sec + uVar19),0x1ff - uVar19);
            lVar10 = 0;
            if (0 < sVar11) {
              lVar10 = sVar11;
            }
            uVar19 = uVar19 + lVar10;
            if (0 < sVar11) goto LAB_001035c0;
          }
          *(undefined1 *)((long)&local_238[0].tv_sec + uVar19) = 0;
          pcVar12 = strstr((char *)local_238,"\nTracerPid:");
          if (pcVar12 < (char *)((long)&local_59 + 1U) && pcVar12 != (char *)0x0) {
            iVar7 = atoi(pcVar12 + 0xb);
LAB_00103631:
            bVar2 = false;
          }
          else {
            if (uVar19 != 0x1ff) goto LAB_00103631;
            local_238[0].tv_sec = local_59;
            local_238[0].tv_nsec = lStack_51;
            bVar2 = true;
            uVar19 = 0x20;
          }
        } while (bVar2);
        close(iVar23);
        iVar23 = 1;
        if (iVar7 != 0) goto LAB_00103673;
      }
      iVar23 = 0;
    }
  }
LAB_00103673:
  acutest_no_exec_ = iVar23;
  if (acutest_tap_ == '\x01') {
    if (2 < acutest_verbose_level_) {
      acutest_verbose_level_ = 2;
    }
    acutest_no_summary_ = 1;
    if (acutest_worker_ == '\0') {
      lVar10 = 0;
      uVar19 = 0;
      do {
        uVar19 = (ulong)((int)uVar19 +
                        (uint)(*(int *)((long)&acutest_test_data_->state + lVar10) == -2));
        lVar10 = lVar10 + 0x10;
      } while (lVar10 != 0x90);
      printf("1..%d\n",uVar19);
    }
  }
  lVar10 = 0;
  iVar23 = acutest_worker_index_;
  do {
    if (*(int *)((long)&acutest_test_data_->state + lVar10) == -2) {
      test = (acutest_test_ *)((long)&acutest_list_[0].name + lVar10);
      acutest_test_already_logged_ = 0;
      acutest_current_test_ = test;
      clock_gettime(acutest_timer_id_,&local_248);
      if (acutest_no_exec_ == 0) {
        fflush(_stdout);
        fflush(_stderr);
        __pid = fork();
        if (__pid == -1) {
          puVar13 = (uint *)__errno_location();
          pcVar12 = strerror(*puVar13);
          acutest_error_("Cannot fork. %s [%d]",pcVar12,(ulong)*puVar13);
        }
        else {
          if (__pid == 0) {
            acutest_worker_ = 1;
            aVar8 = acutest_do_run_(test,iVar23);
            acutest_exit_(aVar8);
          }
          waitpid(__pid,(int *)&local_24c,0);
          uVar16 = local_24c & 0x7f;
          if (uVar16 == 0) {
            aVar8 = local_24c >> 8 & 0xff;
            goto LAB_00103820;
          }
          if ((int)(uVar16 * 0x1000000 + 0x1000000) < 0x2000000) {
            acutest_error_("Test ended in an unexpected way [%d].",(ulong)local_24c);
          }
          else {
            if ((uVar16 < 0x10) && ((0x452fU >> ((uint)((ulong)uVar16 - 1) & 0x1f) & 1) != 0)) {
              ptVar21 = (timespec *)
                        (&DAT_001062fc + *(int *)(&DAT_001062fc + ((ulong)uVar16 - 1) * 4));
            }
            else {
              snprintf((char *)local_238,0x20,"signal %d");
              ptVar21 = local_238;
            }
            acutest_error_("Test interrupted by %s.",ptVar21);
          }
        }
        aVar8 = ACUTEST_STATE_FAILED;
      }
      else {
        aVar8 = acutest_do_run_(test,iVar23);
      }
LAB_00103820:
      iVar23 = iVar23 + 1;
      clock_gettime(acutest_timer_id_,local_238);
      paVar4 = acutest_test_data_;
      acutest_current_test_ = (acutest_test_ *)0x0;
      *(acutest_state_ *)((long)&acutest_test_data_->state + lVar10) = aVar8;
      *(double *)((long)&paVar4->duration + lVar10) =
           (double)(local_238[0].tv_nsec - local_248.tv_nsec) / 1000000000.0 +
           (double)(local_238[0].tv_sec -
                   CONCAT53(local_248.tv_sec._3_5_,
                            CONCAT12(local_248.tv_sec._2_1_,
                                     CONCAT11(local_248.tv_sec._1_1_,(undefined1)local_248.tv_sec)))
                   );
    }
    lVar10 = lVar10 + 0x10;
  } while (lVar10 != 0x90);
  if (0 < acutest_verbose_level_ && (acutest_no_summary_ & 1) == 0) {
    lVar10 = 0;
    iVar23 = 0;
    do {
      iVar23 = iVar23 + (uint)(*(int *)((long)&acutest_test_data_->state + lVar10) == -1);
      lVar10 = lVar10 + 0x10;
    } while (lVar10 != 0x90);
    lVar10 = 0;
    uVar16 = 0;
    do {
      uVar16 = uVar16 + (*(int *)((long)&acutest_test_data_->state + lVar10) == 0);
      lVar10 = lVar10 + 0x10;
    } while (lVar10 != 0x90);
    lVar10 = 0;
    uVar24 = 0;
    do {
      uVar24 = uVar24 + (*(int *)((long)&acutest_test_data_->state + lVar10) == 1);
      lVar10 = lVar10 + 0x10;
    } while (lVar10 != 0x90);
    if (2 < acutest_verbose_level_) {
      acutest_colored_printf_(10,"Summary:\n");
      printf("  Count of run unit tests:        %4d\n",(ulong)(9U - iVar23));
      printf("  Count of successful unit tests: %4d\n",(ulong)uVar16);
      printf("  Count of failed unit tests:     %4d\n",(ulong)uVar24);
    }
    if (uVar24 == 0) {
      acutest_colored_printf_(0xc,"SUCCESS:");
      puts(" No unit tests have failed.");
    }
    else {
      acutest_colored_printf_(0xb,"FAILED:");
      pcVar12 = "have";
      if (uVar24 == 1) {
        pcVar12 = "has";
      }
      printf(" %d of %d unit tests %s failed.\n",(ulong)uVar24,(ulong)(9U - iVar23),pcVar12);
    }
    if (2 < acutest_verbose_level_) {
      putchar(10);
    }
  }
  __s = acutest_xml_output_;
  if (acutest_xml_output_ != (FILE *)0x0) {
    pcVar12 = *argv;
    pcVar14 = strrchr(pcVar12,0x2f);
    pcVar20 = pcVar14 + 1;
    if (pcVar14 == (char *)0x0) {
      pcVar20 = pcVar12;
    }
    fwrite("<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n",0x27,1,(FILE *)__s);
    lVar10 = 0;
    uVar19 = 0;
    do {
      uVar19 = (ulong)((int)uVar19 +
                      (uint)(*(int *)((long)&acutest_test_data_->state + lVar10) == 1));
      lVar10 = lVar10 + 0x10;
    } while (lVar10 != 0x90);
    lVar10 = 0;
    iVar23 = 0;
    do {
      iVar23 = iVar23 + (uint)(*(int *)((long)&acutest_test_data_->state + lVar10) == 2);
      lVar10 = lVar10 + 0x10;
    } while (lVar10 != 0x90);
    lVar10 = 0;
    iVar7 = 0;
    do {
      iVar7 = iVar7 + (uint)(*(int *)((long)&acutest_test_data_->state + lVar10) == -1);
      lVar10 = lVar10 + 0x10;
    } while (lVar10 != 0x90);
    fprintf((FILE *)acutest_xml_output_,
            "<testsuite name=\"%s\" tests=\"%d\" errors=\"0\" failures=\"%d\" skip=\"%d\">\n",
            pcVar20,9,uVar19,(ulong)(uint)(iVar7 + iVar23));
    lVar10 = 0;
    do {
      paVar4 = acutest_test_data_;
      bVar2 = true;
      fprintf((FILE *)acutest_xml_output_,"  <testcase name=\"%s\" time=\"%.2f\">\n",
              *(undefined8 *)((long)&acutest_test_data_->duration + lVar10),
              *(undefined8 *)((long)&acutest_list_[0].name + lVar10));
      iVar23 = *(int *)((long)&paVar4->state + lVar10);
      if (iVar23 == 2) {
LAB_00103b07:
        bVar2 = false;
        pcVar12 = "<skipped />";
      }
      else if (iVar23 == 0) {
        pcVar12 = (char *)0x0;
      }
      else {
        if (iVar23 == -1) goto LAB_00103b07;
        bVar2 = false;
        pcVar12 = "<failure />";
      }
      if (!bVar2) {
        fprintf((FILE *)acutest_xml_output_,"    %s\n",pcVar12);
      }
      fwrite("  </testcase>\n",0xe,1,(FILE *)acutest_xml_output_);
      lVar10 = lVar10 + 0x10;
    } while (lVar10 != 0x90);
    fwrite("</testsuite>\n",0xd,1,(FILE *)acutest_xml_output_);
    fclose((FILE *)acutest_xml_output_);
  }
  if (acutest_worker_ == '\x01') {
    lVar10 = 0;
    iVar23 = 0;
    do {
      iVar23 = iVar23 + (uint)(*(int *)((long)&acutest_test_data_->state + lVar10) == -1);
      lVar10 = lVar10 + 0x10;
    } while (lVar10 != 0x90);
    if (iVar23 == 8) {
      lVar10 = 0;
      do {
        uVar16 = *(uint *)((long)&acutest_test_data_->state + lVar10);
        if (uVar16 != 0xffffffff) goto LAB_00103c0a;
        lVar10 = lVar10 + 0x10;
      } while (lVar10 != 0x90);
      uVar16 = 1;
      goto LAB_00103c0a;
    }
  }
  lVar10 = 0;
  iVar23 = 0;
  do {
    iVar23 = iVar23 + (uint)(*(int *)((long)&acutest_test_data_->state + lVar10) == 1);
    lVar10 = lVar10 + 0x10;
  } while (lVar10 != 0x90);
  uVar16 = (uint)(iVar23 != 0);
LAB_00103c0a:
  free(acutest_test_data_);
  return uVar16;
  while( true ) {
    cVar15 = pcVar12[lVar10 + 3];
    lVar10 = lVar10 + 1;
    iVar6 = local_278;
    if (cVar15 == '\0') break;
LAB_001032c7:
    iVar7 = 0x58;
    pAVar22 = acutest_cmdline_options_;
    if (cVar15 != 'X') {
      pAVar9 = acutest_cmdline_options_;
      do {
        iVar7 = pAVar9[1].id;
        if (iVar7 == 0) {
          iVar6 = -0x7fffffff;
          goto LAB_00103306;
        }
        pAVar22 = pAVar9 + 1;
        pAVar1 = pAVar9 + 1;
        pAVar9 = pAVar22;
      } while (cVar15 != pAVar1->shortname);
    }
    iVar6 = -0x7ffffffe;
    if ((pAVar22->flags & 2) == 0) {
      ptVar21 = (timespec *)0x0;
      iVar6 = iVar7;
    }
    else {
LAB_00103306:
      local_248.tv_sec._0_1_ = 0x2d;
      local_248.tv_sec._2_1_ = 0;
      ptVar21 = &local_248;
      local_248.tv_sec._1_1_ = cVar15;
    }
    iVar6 = acutest_cmdline_callback_(iVar6,(char *)ptVar21);
    if (iVar6 != 0) break;
  }
LAB_00103361:
  local_278 = iVar6;
  bVar2 = false;
  if (bVar25) {
    ptVar21 = (timespec *)argv[iVar23];
    if ((char)ptVar21->tv_sec == '-') {
      iVar7 = strncmp((char *)ptVar21,"--",2);
      __dest = ptVar21;
      if ((iVar7 == 0) && (pcVar12 = strchr((char *)ptVar21,0x3d), pcVar12 != (char *)0x0)) {
        sVar18 = (long)pcVar12 - (long)ptVar21;
        if (0x1f < sVar18) {
          sVar18 = 0x20;
        }
        __dest = local_238;
        strncpy((char *)__dest,(char *)ptVar21,sVar18);
        *(undefined1 *)((long)&local_238[0].tv_sec + sVar18) = 0;
      }
      iVar7 = -0x7fffffff;
      ptVar21 = __dest;
    }
    else {
      iVar7 = 0;
    }
    bVar2 = false;
LAB_001030c2:
    local_278 = acutest_cmdline_callback_(iVar7,(char *)ptVar21);
  }
LAB_001030c7:
  if ((local_278 != 0) || (iVar23 = iVar23 + 1, argc <= iVar23)) goto LAB_00103453;
  goto LAB_001030b0;
}

Assistant:

int
main(int argc, char** argv)
{
    int i, index;
    int exit_code = 1;

    acutest_argv0_ = argv[0];

#if defined ACUTEST_UNIX_
    acutest_colorize_ = isatty(STDOUT_FILENO);
#elif defined ACUTEST_WIN_
 #if defined _BORLANDC_
    acutest_colorize_ = isatty(_fileno(stdout));
 #else
    acutest_colorize_ = _isatty(_fileno(stdout));
 #endif
#else
    acutest_colorize_ = 0;
#endif

    /* Count all test units */
    acutest_list_size_ = 0;
    for(i = 0; acutest_list_[i].func != NULL; i++)
        acutest_list_size_++;

    acutest_test_data_ = (struct acutest_test_data_*)calloc(acutest_list_size_, sizeof(struct acutest_test_data_));
    if(acutest_test_data_ == NULL) {
        fprintf(stderr, "Out of memory.\n");
        acutest_exit_(2);
    }

    /* Parse options */
    acutest_cmdline_read_(acutest_cmdline_options_, argc, argv, acutest_cmdline_callback_);

    /* Initialize the proper timer. */
    acutest_timer_init_();

#if defined(ACUTEST_WIN_)
    SetUnhandledExceptionFilter(acutest_seh_exception_filter_);
#ifdef _MSC_VER
    _set_abort_behavior(0, _WRITE_ABORT_MSG);
#endif
#endif

    /* Determine what to run. */
    if(acutest_count_(ACUTEST_STATE_SELECTED) > 0) {
        enum acutest_state_ if_selected;
        enum acutest_state_ if_unselected;

        if(!acutest_exclude_mode_) {
            if_selected = ACUTEST_STATE_NEEDTORUN;
            if_unselected = ACUTEST_STATE_EXCLUDED;
        } else {
            if_selected = ACUTEST_STATE_EXCLUDED;
            if_unselected = ACUTEST_STATE_NEEDTORUN;
        }

        for(i = 0; acutest_list_[i].func != NULL; i++) {
            if(acutest_test_data_[i].state == ACUTEST_STATE_SELECTED)
                acutest_test_data_[i].state = if_selected;
            else
                acutest_test_data_[i].state = if_unselected;
        }
    } else {
        /* By default, we want to run all tests. */
        for(i = 0; acutest_list_[i].func != NULL; i++)
            acutest_test_data_[i].state = ACUTEST_STATE_NEEDTORUN;
    }

    /* By default, we want to suppress running tests as child processes if we
     * run just one test, or if we're under debugger: Debugging tests is then
     * so much easier. */
    if(acutest_no_exec_ < 0) {
        if(acutest_count_(ACUTEST_STATE_NEEDTORUN) <= 1  ||  acutest_under_debugger_())
            acutest_no_exec_ = 1;
        else
            acutest_no_exec_ = 0;
    }

    if(acutest_tap_) {
        /* TAP requires we know test result ("ok", "not ok") before we output
         * anything about the test, and this gets problematic for larger verbose
         * levels. */
        if(acutest_verbose_level_ > 2)
            acutest_verbose_level_ = 2;

        /* TAP harness should provide some summary. */
        acutest_no_summary_ = 1;

        if(!acutest_worker_)
            printf("1..%d\n", acutest_count_(ACUTEST_STATE_NEEDTORUN));
    }

    index = acutest_worker_index_;
    for(i = 0; acutest_list_[i].func != NULL; i++) {
        if(acutest_test_data_[i].state == ACUTEST_STATE_NEEDTORUN)
            acutest_run_(&acutest_list_[i], index++, i);
    }

    /* Write a summary */
    if(!acutest_no_summary_ && acutest_verbose_level_ >= 1) {
        int n_run, n_success, n_failed ;

        n_run = acutest_list_size_ - acutest_count_(ACUTEST_STATE_EXCLUDED);
        n_success = acutest_count_(ACUTEST_STATE_SUCCESS);
        n_failed = acutest_count_(ACUTEST_STATE_FAILED);

        if(acutest_verbose_level_ >= 3) {
            acutest_colored_printf_(ACUTEST_COLOR_DEFAULT_INTENSIVE_, "Summary:\n");

            printf("  Count of run unit tests:        %4d\n", n_run);
            printf("  Count of successful unit tests: %4d\n", n_success);
            printf("  Count of failed unit tests:     %4d\n", n_failed);
        }

        if(n_failed == 0) {
            acutest_colored_printf_(ACUTEST_COLOR_GREEN_INTENSIVE_, "SUCCESS:");
            printf(" No unit tests have failed.\n");
        } else {
            acutest_colored_printf_(ACUTEST_COLOR_RED_INTENSIVE_, "FAILED:");
            printf(" %d of %d unit tests %s failed.\n",
                    n_failed, n_run, (n_failed == 1) ? "has" : "have");
        }

        if(acutest_verbose_level_ >= 3)
            printf("\n");
    }

    if (acutest_xml_output_) {
        const char* suite_name = acutest_basename_(argv[0]);
        fprintf(acutest_xml_output_, "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n");
        fprintf(acutest_xml_output_, "<testsuite name=\"%s\" tests=\"%d\" errors=\"0\" failures=\"%d\" skip=\"%d\">\n",
            suite_name,
            (int)acutest_list_size_,
            acutest_count_(ACUTEST_STATE_FAILED),
            acutest_count_(ACUTEST_STATE_SKIPPED) + acutest_count_(ACUTEST_STATE_EXCLUDED));
        for(i = 0; acutest_list_[i].func != NULL; i++) {
            struct acutest_test_data_ *details = &acutest_test_data_[i];
            const char* str_state;
            fprintf(acutest_xml_output_, "  <testcase name=\"%s\" time=\"%.2f\">\n", acutest_list_[i].name, details->duration);

            switch(details->state) {
                case ACUTEST_STATE_SUCCESS:     str_state = NULL; break;
                case ACUTEST_STATE_EXCLUDED:    /* Fall through. */
                case ACUTEST_STATE_SKIPPED:     str_state = "<skipped />"; break;
                case ACUTEST_STATE_FAILED:      /* Fall through. */
                default:                        str_state = "<failure />"; break;
            }

            if(str_state != NULL)
                fprintf(acutest_xml_output_, "    %s\n", str_state);
            fprintf(acutest_xml_output_, "  </testcase>\n");
        }
        fprintf(acutest_xml_output_, "</testsuite>\n");
        fclose(acutest_xml_output_);
    }

    if(acutest_worker_  &&  acutest_count_(ACUTEST_STATE_EXCLUDED)+1 == acutest_list_size_) {
        /* If we are the child process, we need to propagate the test state
         * without any moderation. */
        for(i = 0; acutest_list_[i].func != NULL; i++) {
            if(acutest_test_data_[i].state != ACUTEST_STATE_EXCLUDED) {
                exit_code = (int) acutest_test_data_[i].state;
                break;
            }
        }
    } else {
        if(acutest_count_(ACUTEST_STATE_FAILED) > 0)
            exit_code = 1;
        else
            exit_code = 0;
    }

    acutest_cleanup_();
    return exit_code;
}